

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.hpp
# Opt level: O0

string * backend::codegen::format_load_pc_label_abi_cxx11_
                   (string_view function_name,uint32_t label_id)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  ostream *this;
  uint in_ECX;
  string *in_RDI;
  stringstream s;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffe10;
  size_t in_stack_fffffffffffffe18;
  string *psVar2;
  stringstream local_1a8 [16];
  ostream local_198 [380];
  uint local_1c;
  
  psVar2 = in_RDI;
  local_1c = in_ECX;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(local_198,".ld_pc_");
  __str._M_str = (char *)psVar2;
  __str._M_len = in_stack_fffffffffffffe18;
  pbVar1 = std::operator<<(in_stack_fffffffffffffe10,__str);
  this = std::operator<<(pbVar1,"$");
  std::ostream::operator<<(this,local_1c);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return in_RDI;
}

Assistant:

inline std::string format_load_pc_label(std::string_view function_name,
                                        uint32_t label_id) {
  auto s = std::stringstream();
  s << ".ld_pc_" << function_name << "$" << label_id;
  return s.str();
}